

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

idx_t duckdb::BinaryExecutor::
      SelectGenericLoop<unsigned_char,unsigned_char,duckdb::GreaterThan,true,true,false>
                (uchar *ldata,uchar *rdata,SelectionVector *lsel,SelectionVector *rsel,
                SelectionVector *result_sel,idx_t count,ValidityMask *lvalidity,
                ValidityMask *rvalidity,SelectionVector *true_sel,SelectionVector *false_sel)

{
  idx_t iVar1;
  ulong uVar2;
  idx_t i;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long *in_stack_00000018;
  
  iVar1 = 0;
  for (uVar3 = 0; count != uVar3; uVar3 = uVar3 + 1) {
    uVar2 = uVar3;
    if (result_sel->sel_vector != (sel_t *)0x0) {
      uVar2 = (ulong)result_sel->sel_vector[uVar3];
    }
    uVar4 = uVar3;
    if (lsel->sel_vector != (sel_t *)0x0) {
      uVar4 = (ulong)lsel->sel_vector[uVar3];
    }
    uVar5 = uVar3;
    if (rsel->sel_vector != (sel_t *)0x0) {
      uVar5 = (ulong)rsel->sel_vector[uVar3];
    }
    if (rdata[uVar5] < ldata[uVar4]) {
      *(int *)(*in_stack_00000018 + iVar1 * 4) = (int)uVar2;
      iVar1 = iVar1 + 1;
    }
  }
  return iVar1;
}

Assistant:

static inline idx_t
	SelectGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                  const SelectionVector *__restrict lsel, const SelectionVector *__restrict rsel,
	                  const SelectionVector *__restrict result_sel, idx_t count, ValidityMask &lvalidity,
	                  ValidityMask &rvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
#ifdef DUCKDB_SMALLER_BINARY
		const bool HAS_TRUE_SEL = true_sel;
		const bool HAS_FALSE_SEL = false_sel;
		const bool NO_NULL = false;
#endif
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto lindex = lsel->get_index(i);
			auto rindex = rsel->get_index(i);
			if ((NO_NULL || (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex))) &&
			    OP::Operation(ldata[lindex], rdata[rindex])) {
				if (HAS_TRUE_SEL) {
					true_sel->set_index(true_count++, result_idx);
				}
			} else {
				if (HAS_FALSE_SEL) {
					false_sel->set_index(false_count++, result_idx);
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}